

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanTag(Scanner *this)

{
  undefined1 uVar1;
  char cVar2;
  ulong uVar3;
  Stream *in_RDI;
  Mark MVar4;
  bool canBeHandle;
  string tag;
  Token token;
  Stream *in_stack_fffffffffffffee8;
  Stream *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefd;
  char in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  string local_f8 [32];
  string local_d8 [39];
  byte local_b1;
  string local_b0 [48];
  Mark local_80;
  undefined8 local_70;
  int local_68;
  Stream *in_stack_ffffffffffffffa8;
  string local_48 [8];
  bool *in_stack_ffffffffffffffc0;
  Stream *in_stack_ffffffffffffffc8;
  Scanner *in_stack_ffffffffffffffd0;
  _Tp_alloc_type local_10;
  undefined3 uStack_f;
  
  InsertPotentialSimpleKey(in_stack_ffffffffffffffd0);
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = 0;
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 0;
  MVar4 = YAML::Stream::mark(in_RDI);
  local_80.column = MVar4.column;
  local_68 = local_80.column;
  local_80._0_8_ = MVar4._0_8_;
  local_70._0_4_ = local_80.pos;
  local_70._4_4_ = local_80.line;
  local_80 = MVar4;
  Token::Token((Token *)in_RDI,
               CONCAT13(in_stack_fffffffffffffeff,
                        CONCAT12(in_stack_fffffffffffffefe,
                                 CONCAT11(in_stack_fffffffffffffefd,in_stack_fffffffffffffefc))),
               (Mark *)in_stack_fffffffffffffef0);
  YAML::Stream::get(in_stack_fffffffffffffef0);
  uVar1 = YAML::Stream::operator_cast_to_bool(in_RDI);
  if (((bool)uVar1) &&
     (in_stack_fffffffffffffefe = YAML::Stream::peek(in_stack_fffffffffffffee8),
     in_stack_fffffffffffffefe == '<')) {
    ScanVerbatimTag_abi_cxx11_(in_stack_ffffffffffffffa8);
    std::__cxx11::string::operator=(local_48,local_b0);
    local_10 = (_Tp_alloc_type)0x0;
    uStack_f = 0;
    std::__cxx11::string::~string(local_b0);
  }
  else {
    ScanTagHandle_abi_cxx11_(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::__cxx11::string::operator=(local_48,local_d8);
    std::__cxx11::string::~string(local_d8);
    if (((local_b1 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      local_10 = (_Tp_alloc_type)0x4;
      uStack_f = 0;
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_10 = (_Tp_alloc_type)0x1;
        uStack_f = 0;
      }
      else {
        local_10 = (_Tp_alloc_type)0x2;
        uStack_f = 0;
      }
    }
    if (((local_b1 & 1) != 0) &&
       (cVar2 = YAML::Stream::peek(in_stack_fffffffffffffee8), cVar2 == '!')) {
      YAML::Stream::get(in_stack_fffffffffffffef0);
      in_stack_fffffffffffffef0 = (Stream *)&stack0xffffffffffffffd8;
      ScanTagSuffix_abi_cxx11_(in_stack_ffffffffffffffa8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDI,
                  (value_type *)
                  CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffefe,
                                          CONCAT15(cVar2,CONCAT14(in_stack_fffffffffffffefc,
                                                                  in_stack_fffffffffffffef8)))));
      std::__cxx11::string::~string(local_f8);
      local_10 = (_Tp_alloc_type)0x3;
      uStack_f = 0;
    }
  }
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)
             in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
  Token::~Token((Token *)in_stack_fffffffffffffef0);
  return;
}

Assistant:

void Scanner::ScanTag() {
  // insert a potential simple key
  InsertPotentialSimpleKey();
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = false;

  Token token(Token::TAG, INPUT.mark());

  // eat the indicator
  INPUT.get();

  if (INPUT && INPUT.peek() == Keys::VerbatimTagStart) {
    std::string tag = ScanVerbatimTag(INPUT);

    token.value = tag;
    token.data = Tag::VERBATIM;
  } else {
    bool canBeHandle;
    token.value = ScanTagHandle(INPUT, canBeHandle);
    if (!canBeHandle && token.value.empty())
      token.data = Tag::NON_SPECIFIC;
    else if (token.value.empty())
      token.data = Tag::SECONDARY_HANDLE;
    else
      token.data = Tag::PRIMARY_HANDLE;

    // is there a suffix?
    if (canBeHandle && INPUT.peek() == Keys::Tag) {
      // eat the indicator
      INPUT.get();
      token.params.push_back(ScanTagSuffix(INPUT));
      token.data = Tag::NAMED_HANDLE;
    }
  }

  m_tokens.push(token);
}